

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseRefTypeOpt(WastParser *this,Type *out_type)

{
  bool bVar1;
  Type TVar2;
  Token token;
  
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    Consume(&token,this);
    TVar2 = Token::type(&token);
    if ((TVar2.enum_ != ExternRef) || ((this->options_->features).reference_types_enabled_ == true))
    {
      out_type->enum_ = (Enum)TVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool WastParser::ParseRefTypeOpt(Type* out_type) {
  WABT_TRACE(ParseRefTypeOpt);
  if (!PeekMatch(TokenType::ValueType)) {
    return false;
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    return false;
  }

  *out_type = type;
  return true;
}